

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

GatherAlongAxisLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_gatheralongaxis(NeuralNetworkLayer *this)

{
  GatherAlongAxisLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x3b8) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3b8;
    this_00 = (GatherAlongAxisLayerParams *)operator_new(0x20);
    GatherAlongAxisLayerParams::GatherAlongAxisLayerParams(this_00);
    (this->layer_).gatheralongaxis_ = this_00;
  }
  return (GatherAlongAxisLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GatherAlongAxisLayerParams* NeuralNetworkLayer::mutable_gatheralongaxis() {
  if (!has_gatheralongaxis()) {
    clear_layer();
    set_has_gatheralongaxis();
    layer_.gatheralongaxis_ = new ::CoreML::Specification::GatherAlongAxisLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.gatherAlongAxis)
  return layer_.gatheralongaxis_;
}